

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileOptions::FileOptions(FileOptions *this,FileOptions *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  Arena *pAVar15;
  
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_003b9af8;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(from->uninterpreted_option_).super_RepeatedPtrFieldBase);
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  (this->java_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar14 = (from->_has_bits_).has_bits_[0];
  if ((uVar14 & 1) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->java_package_,pAVar15,(from->java_package_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->java_outer_classname_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar14 & 2) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->java_outer_classname_,pAVar15,(from->java_outer_classname_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->go_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar14 & 4) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance(&this->go_package_,pAVar15,(from->go_package_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->objc_class_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar14 & 8) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->objc_class_prefix_,pAVar15,(from->objc_class_prefix_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->csharp_namespace_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar14 & 0x10) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->csharp_namespace_,pAVar15,(from->csharp_namespace_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->swift_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar14 & 0x20) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->swift_prefix_,pAVar15,(from->swift_prefix_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->php_class_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar14 & 0x40) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->php_class_prefix_,pAVar15,(from->php_class_prefix_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->php_namespace_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((char)uVar14 < '\0') {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->php_namespace_,pAVar15,(from->php_namespace_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->php_metadata_namespace_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar14 >> 8 & 1) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->php_metadata_namespace_,pAVar15,(from->php_metadata_namespace_).ptr_);
    uVar14 = (from->_has_bits_).has_bits_[0];
  }
  (this->ruby_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar14 >> 9 & 1) != 0) {
    pAVar15 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar15 & 1) != 0) {
      pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->ruby_package_,pAVar15,(from->ruby_package_).ptr_);
  }
  bVar6 = from->java_multiple_files_;
  bVar7 = from->java_generate_equals_and_hash_;
  bVar8 = from->java_string_check_utf8_;
  bVar9 = from->cc_generic_services_;
  bVar10 = from->java_generic_services_;
  bVar11 = from->py_generic_services_;
  bVar12 = from->php_generic_services_;
  bVar13 = from->deprecated_;
  bVar2 = from->php_generic_services_;
  bVar3 = from->deprecated_;
  iVar4 = from->optimize_for_;
  bVar5 = from->cc_enable_arenas_;
  this->py_generic_services_ = from->py_generic_services_;
  this->php_generic_services_ = bVar2;
  this->deprecated_ = bVar3;
  this->optimize_for_ = iVar4;
  this->cc_enable_arenas_ = bVar5;
  this->java_multiple_files_ = bVar6;
  this->java_generate_equals_and_hash_ = bVar7;
  this->java_string_check_utf8_ = bVar8;
  this->cc_generic_services_ = bVar9;
  this->java_generic_services_ = bVar10;
  this->py_generic_services_ = bVar11;
  this->php_generic_services_ = bVar12;
  this->deprecated_ = bVar13;
  return;
}

Assistant:

FileOptions::FileOptions(const FileOptions& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      uninterpreted_option_(from.uninterpreted_option_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  java_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_java_package()) {
    java_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_java_package(),
      GetArena());
  }
  java_outer_classname_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_java_outer_classname()) {
    java_outer_classname_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_java_outer_classname(),
      GetArena());
  }
  go_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_go_package()) {
    go_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_go_package(),
      GetArena());
  }
  objc_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_objc_class_prefix()) {
    objc_class_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_objc_class_prefix(),
      GetArena());
  }
  csharp_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_csharp_namespace()) {
    csharp_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_csharp_namespace(),
      GetArena());
  }
  swift_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_swift_prefix()) {
    swift_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_swift_prefix(),
      GetArena());
  }
  php_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_class_prefix()) {
    php_class_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_class_prefix(),
      GetArena());
  }
  php_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_namespace()) {
    php_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_namespace(),
      GetArena());
  }
  php_metadata_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_metadata_namespace()) {
    php_metadata_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_metadata_namespace(),
      GetArena());
  }
  ruby_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_ruby_package()) {
    ruby_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_ruby_package(),
      GetArena());
  }
  ::memcpy(&java_multiple_files_, &from.java_multiple_files_,
    static_cast<size_t>(reinterpret_cast<char*>(&cc_enable_arenas_) -
    reinterpret_cast<char*>(&java_multiple_files_)) + sizeof(cc_enable_arenas_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileOptions)
}